

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

Write<double> __thiscall Omega_h::deep_copy<double>(Omega_h *this,Read<signed_char> *a,string *name)

{
  char *file;
  ulong uVar1;
  void *extraout_RDX;
  Write<double> WVar2;
  Write<double> local_128;
  Read<double> local_118;
  undefined1 local_101;
  undefined1 local_100 [8];
  string name2;
  __cxx11 local_e0 [55];
  allocator local_a9;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [39];
  ScopedTimer local_41;
  string *psStack_40;
  ScopedTimer omega_h_scoped_function_timer;
  string *name_local;
  Read<signed_char> *a_local;
  Write<double> *b;
  ulong local_10;
  
  psStack_40 = name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array.cpp"
             ,&local_a9);
  std::operator+(local_88,(char *)local_a8);
  std::__cxx11::to_string(local_e0,0x15a);
  std::operator+(local_68,local_88);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_41,"deep_copy",file);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)local_100,(string *)psStack_40);
  }
  else {
    Read<double>::name_abi_cxx11_((Read<double> *)local_100);
  }
  local_101 = 0;
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  Write<double>::Write((Write<double> *)this,(LO)(local_10 >> 3),(string *)local_100);
  Read<double>::Read(&local_118,(Read<double> *)a);
  Write<double>::Write(&local_128,(Write<double> *)this);
  copy_into<double>((Read<signed_char> *)&local_118,&local_128);
  Write<double>::~Write(&local_128);
  Read<double>::~Read(&local_118);
  local_101 = 1;
  std::__cxx11::string::~string((string *)local_100);
  ScopedTimer::~ScopedTimer(&local_41);
  WVar2.shared_alloc_.direct_ptr = extraout_RDX;
  WVar2.shared_alloc_.alloc = (Alloc *)this;
  return (Write<double>)WVar2.shared_alloc_;
}

Assistant:

Write<T> deep_copy(Read<T> a, std::string const& name) {
  OMEGA_H_TIME_FUNCTION;
  auto name2 = name.empty() ? a.name() : name;
  Write<T> b(a.size(), name2);
  copy_into(a, b);
  return b;
}